

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::StartCoverageLogXML(cmCTestCoverageHandler *this,cmXMLWriter *xml)

{
  cmXMLWriter *pcVar1;
  double dVar2;
  uint local_c0;
  allocator local_b9;
  string local_b8;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestCoverageHandler *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CoverageLog",&local_39);
  cmXMLWriter::StartElement(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"StartDateTime",&local_71);
  cmCTest::CurrentTime_abi_cxx11_(&local_98,(this->super_cmCTestGenericHandler).CTest);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"StartTime",&local_b9);
  dVar2 = cmsys::SystemTools::GetTime();
  local_c0 = (uint)(long)dVar2;
  cmXMLWriter::Element<unsigned_int>(pcVar1,&local_b8,&local_c0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void cmCTestCoverageHandler::StartCoverageLogXML(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("CoverageLog");
  xml.Element("StartDateTime", this->CTest->CurrentTime());
  xml.Element("StartTime",
              static_cast<unsigned int>(cmSystemTools::GetTime()));
}